

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureLayerCase::test
          (AttachmentTextureLayerCase *this)

{
  GLenum local_24;
  GLuint local_20;
  int layer_1;
  GLuint textureID_1;
  int layer;
  GLuint textureID;
  GLuint framebufferID;
  AttachmentTextureLayerCase *this_local;
  
  layer = 0;
  _textureID = this;
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,(GLuint *)&layer);
  glu::CallLogWrapper::glBindFramebuffer(&(this->super_ApiCase).super_CallLogWrapper,0x8d40,layer);
  ApiCase::expectError(&this->super_ApiCase,0);
  textureID_1 = 0;
  glu::CallLogWrapper::glGenTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&textureID_1);
  glu::CallLogWrapper::glBindTexture(&(this->super_ApiCase).super_CallLogWrapper,0x806f,textureID_1)
  ;
  glu::CallLogWrapper::glTexStorage3D
            (&(this->super_ApiCase).super_CallLogWrapper,0x806f,1,0x8058,0x10,0x10,0x10);
  for (layer_1 = 0; layer_1 < 0x10; layer_1 = layer_1 + 1) {
    glu::CallLogWrapper::glFramebufferTextureLayer
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,textureID_1,0,layer_1);
    checkColorAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd4,layer_1);
  }
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&textureID_1);
  local_20 = 0;
  glu::CallLogWrapper::glGenTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_20);
  glu::CallLogWrapper::glBindTexture(&(this->super_ApiCase).super_CallLogWrapper,0x8c1a,local_20);
  glu::CallLogWrapper::glTexStorage3D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8c1a,1,0x8058,0x10,0x10,0x10);
  for (local_24 = 0; (int)local_24 < 0x10; local_24 = local_24 + 1) {
    glu::CallLogWrapper::glFramebufferTextureLayer
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,local_20,0,local_24);
    checkColorAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd4,local_24);
  }
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_20);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,(GLuint *)&layer);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// tex3d
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_3D, textureID);
			glTexStorage3D(GL_TEXTURE_3D, 1, GL_RGBA8, 16, 16, 16);

			for (int layer = 0; layer < 16; ++layer)
			{
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureID, 0, layer);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER, layer);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}
		// tex2d array
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D_ARRAY, textureID);
			glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 16, 16, 16);

			for (int layer = 0; layer < 16; ++layer)
			{
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureID, 0, layer);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER, layer);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}